

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int mov_mem_imm(em8051 *aCPU)

{
  byte bVar1;
  uchar uVar2;
  ulong uVar3;
  
  uVar3 = (long)aCPU->mCodeMemSize - 1;
  bVar1 = aCPU->mCodeMem[(long)aCPU->mPC + 1U & uVar3];
  uVar2 = aCPU->mCodeMem[(long)(int)uVar3 & (long)aCPU->mPC + 2U];
  if ((char)bVar1 < '\0') {
    aCPU->mSFR[(ulong)bVar1 - 0x80] = uVar2;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,(uint)bVar1);
    }
  }
  else {
    aCPU->mLowerData[bVar1] = uVar2;
  }
  aCPU->mPC = aCPU->mPC + 3;
  return 1;
}

Assistant:

static int mov_mem_imm(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80] = OPERAND2;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address] = OPERAND2;
    }

    PC += 3;
    return 1;
}